

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *p;
  Fts3HashElem *pFVar5;
  char *pcVar6;
  sqlite3_vtab *psVar7;
  char **ppcVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  char *pcVar9;
  sqlite3 *psVar10;
  sqlite3_vtab **ppsVar11;
  char **ppcVar12;
  ulong uVar13;
  ulong uVar14;
  sqlite3_module *psVar15;
  uint uVar16;
  sqlite3_tokenizer *pTok;
  sqlite3 *local_50;
  char **local_48;
  sqlite3_vtab **local_40;
  ulong local_38;
  
  uVar13 = (ulong)(uint)argc;
  local_50 = (sqlite3 *)0x0;
  pcVar9 = "CREATE TABLE x(input, token, start, end, position)";
  ppcVar8 = argv;
  ppsVar11 = ppVtab;
  ppcVar12 = pzErr;
  iVar1 = sqlite3_declare_vtab(db,"CREATE TABLE x(input, token, start, end, position)");
  if (iVar1 != 0) {
    return iVar1;
  }
  p = (undefined8 *)0x0;
  iVar1 = 0;
  uVar16 = argc - 3;
  pcVar6 = "simple";
  local_40 = ppVtab;
  if (uVar16 == 0) {
LAB_00188195:
    pcVar9 = pcVar6;
    sVar4 = strlen(pcVar9);
    pFVar5 = sqlite3Fts3HashFindElem((Fts3Hash *)pHash,pcVar9,(int)sVar4 + 1);
    if ((pFVar5 == (Fts3HashElem *)0x0) ||
       (psVar15 = (sqlite3_module *)pFVar5->data, psVar15 == (sqlite3_module *)0x0)) {
      psVar15 = (sqlite3_module *)0x0;
      pcVar6 = sqlite3_mprintf("unknown tokenizer: %s");
      *pzErr = pcVar6;
      iVar2 = 1;
      iVar1 = extraout_EDX_01;
    }
    else {
      pcVar9 = (char *)(p + 1);
      psVar10 = (sqlite3 *)0x0;
      if (4 < argc) {
        psVar10 = (sqlite3 *)(ulong)(argc - 4);
      }
      iVar2 = (*psVar15->xCreate)(psVar10,pcVar9,(int)&local_50,ppcVar8,ppsVar11,ppcVar12);
      iVar1 = extraout_EDX_00;
      if (iVar2 == 0) {
        iVar3 = sqlite3_initialize();
        iVar2 = 7;
        iVar1 = extraout_EDX_02;
        if ((iVar3 == 0) &&
           (psVar7 = (sqlite3_vtab *)sqlite3Malloc(0x28), iVar1 = extraout_EDX_03,
           psVar7 != (sqlite3_vtab *)0x0)) {
          psVar7->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar7->nRef = 0;
          psVar7->zErrMsg = (char *)0x0;
          psVar7[1].pModule = psVar15;
          *(sqlite3 **)&psVar7[1].nRef = local_50;
          *local_40 = psVar7;
          iVar2 = 0;
          goto LAB_0018820a;
        }
      }
    }
  }
  else {
    local_48 = pzErr;
    if (3 < argc) {
      uVar14 = 0;
      iVar1 = 0;
      do {
        sVar4 = strlen(argv[uVar14 + 3]);
        iVar1 = iVar1 + (int)sVar4 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    p = (undefined8 *)sqlite3_malloc(iVar1 + uVar16 * 8);
    local_38 = uVar13;
    if ((3 < argc) && (p != (undefined8 *)0x0)) {
      pcVar9 = (char *)(p + uVar16);
      uVar13 = 0;
      do {
        sVar4 = strlen(argv[uVar13 + 3]);
        p[uVar13] = pcVar9;
        sVar4 = (size_t)((int)sVar4 + 1);
        memcpy(pcVar9,argv[uVar13 + 3],sVar4);
        sqlite3Fts3Dequote(pcVar9);
        pcVar9 = pcVar9 + sVar4;
        uVar13 = uVar13 + 1;
      } while (uVar16 != uVar13);
LAB_00188175:
      argc = (int)local_38;
      pzErr = local_48;
      if (argc < 4) {
        pcVar6 = "simple";
      }
      else {
        pcVar6 = (char *)*p;
      }
      goto LAB_00188195;
    }
    if (p != (undefined8 *)0x0) goto LAB_00188175;
    iVar2 = 7;
    p = (undefined8 *)0x0;
    psVar15 = (sqlite3_module *)0x0;
    iVar1 = extraout_EDX;
  }
  if (local_50 != (sqlite3 *)0x0) {
    (*psVar15->xConnect)(local_50,pcVar9,iVar1,ppcVar8,ppsVar11,ppcVar12);
  }
LAB_0018820a:
  sqlite3_free(p);
  return iVar2;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}